

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::ArchiveIN(ChBody *this,ChArchiveIn *marchive)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  ChArchiveIn *this_00;
  pointer psVar7;
  pointer psVar8;
  ulong uVar9;
  ulong uVar10;
  pointer psVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  bool mflag;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  tempforces;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  tempmarkers;
  byte local_b1;
  char *local_b0;
  shared_ptr<chrono::collision::ChCollisionModel> *local_a8;
  undefined1 local_a0;
  shared_ptr<chrono::ChForce> local_98;
  shared_ptr<chrono::ChMarker> local_88;
  undefined **local_78;
  ChVariablesBodyOwnMass *local_70;
  undefined1 local_68 [16];
  pointer local_58;
  ChArchiveIn *local_50;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  local_48;
  
  ChArchiveIn::VersionRead<chrono::ChBody>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  ChBodyFrame::ArchiveIN(&this->super_ChBodyFrame,marchive);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->bflags;
  local_b0 = "bflags";
  local_a0 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_b0);
  local_b0 = "is_fixed";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 7 | this->bflags & 0xffffff7fU;
  local_b0 = "collide";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = this->bflags & 0xfffffffeU | (uint)local_b1;
  local_b0 = "limit_speed";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 8 | this->bflags & 0xfffffeffU;
  local_b0 = "no_gyro_torque";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 0xb | this->bflags & 0xfffff7ffU;
  local_b0 = "use_sleeping";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  this->bflags = (uint)local_b1 << 10 | this->bflags & 0xfffffbffU;
  local_b0 = "is_sleeping";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_b1;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_b0);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_48;
  this->bflags = (uint)local_b1 << 9 | this->bflags & 0xfffffdffU;
  local_b0 = "markers";
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (pointer)0x0;
  local_68 = (undefined1  [16])0x0;
  local_a0 = 0;
  ChArchiveIn::in<std::shared_ptr<chrono::ChMarker>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
                       *)&local_b0);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)local_68;
  local_b0 = "forces";
  local_a0 = 0;
  ChArchiveIn::in<std::shared_ptr<chrono::ChForce>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
                       *)&local_b0);
  psVar7 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (this->marklist).
            super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar11) {
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    lVar5 = -0x10 - (long)psVar7;
    auVar13 = vpbroadcastq_avx512f();
    auVar13 = vpsrlq_avx512f(auVar13,4);
    uVar10 = 0;
    do {
      auVar14 = vpbroadcastq_avx512f();
      uVar9 = uVar10 + 8;
      auVar14 = vporq_avx512f(auVar14,auVar12);
      uVar4 = vpcmpuq_avx512f(auVar14,auVar13,2);
      auVar14 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(psVar7->
                                            super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_refcount._M_pi + uVar10));
      auVar15._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar14._8_8_;
      auVar15._0_8_ = (ulong)((byte)uVar4 & 1) * auVar14._0_8_;
      auVar15._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar14._16_8_;
      auVar15._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar14._24_8_;
      auVar15._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar14._32_8_;
      auVar15._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar14._40_8_;
      auVar15._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar14._48_8_;
      auVar15._56_8_ = (uVar4 >> 7) * auVar14._56_8_;
      psVar7 = psVar7 + 8;
      vpscatterqq_avx512f(ZEXT864(400) + auVar15,uVar4,ZEXT1664((undefined1  [16])0x0));
      uVar10 = uVar9;
    } while ((((ulong)((long)psVar11 + lVar5) >> 4) + 8 & 0x1ffffffffffffff8) != uVar9);
  }
  local_50 = marchive;
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  psVar7 = local_48.
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar11 = local_48.
              super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar11->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var1 = (psVar11->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = p_Var1;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
            goto LAB_0050b04b;
          }
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
LAB_0050b04b:
      AddMarker(this,&local_88);
      if (local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar7);
  }
  psVar8 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    lVar5 = -0x10 - (long)psVar8;
    auVar13 = vpbroadcastq_avx512f();
    auVar13 = vpsrlq_avx512f(auVar13,4);
    uVar10 = 0;
    do {
      auVar14 = vpbroadcastq_avx512f();
      uVar9 = uVar10 + 8;
      auVar14 = vporq_avx512f(auVar14,auVar12);
      uVar4 = vpcmpuq_avx512f(auVar14,auVar13,2);
      auVar14 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(psVar8->
                                            super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_refcount._M_pi + uVar10));
      auVar16._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar14._8_8_;
      auVar16._0_8_ = (ulong)((byte)uVar4 & 1) * auVar14._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar14._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar14._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar14._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar14._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar14._48_8_;
      auVar16._56_8_ = (uVar4 >> 7) * auVar14._56_8_;
      psVar8 = psVar8 + 8;
      vpscatterqq_avx512f(ZEXT864(0x38) + auVar16,uVar4,ZEXT1664((undefined1  [16])0x0));
      uVar10 = uVar9;
    } while ((((ulong)((long)psVar2 + lVar5) >> 4) + 8 & 0x1ffffffffffffff8) != uVar9);
  }
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::clear(&this->forcelist);
  uVar6 = local_68._8_8_;
  if (local_68._0_8_ != local_68._8_8_) {
    psVar8 = (pointer)local_68._0_8_;
    do {
      local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar8->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var1 = (psVar8->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var1;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
            goto LAB_0050b18c;
          }
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
LAB_0050b18c:
      AddForce(this,&local_98);
      if (local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != (pointer)uVar6);
  }
  this_00 = local_50;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->body_id;
  local_b0 = "body_id";
  local_a0 = 0;
  (**(code **)(*(long *)local_50 + 0x38))(local_50);
  local_a8 = &this->collision_model;
  local_b0 = "collision_model";
  local_a0 = 0;
  ChArchiveIn::in<chrono::collision::ChCollisionModel>
            (this_00,(ChNameValue<std::shared_ptr<chrono::collision::ChCollisionModel>_> *)&local_b0
            );
  peVar3 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar3->_vptr_ChCollisionModel[0x16])(peVar3,&this->super_ChContactable_1vars<6>);
  local_70 = (ChVariablesBodyOwnMass *)&this->gyro;
  local_b0 = "gyro";
  local_a0 = 0;
  local_78 = &PTR__ChFunctorArchiveIn_00b03258;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_70 = (ChVariablesBodyOwnMass *)&this->Xforce;
  local_78 = &PTR__ChFunctorArchiveIn_00b03258;
  local_b0 = "Xforce";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_70 = (ChVariablesBodyOwnMass *)&this->Xtorque;
  local_78 = &PTR__ChFunctorArchiveIn_00b03258;
  local_b0 = "Xtorque";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->density;
  local_b0 = "density";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_70 = &this->variables;
  local_78 = &PTR__ChFunctorArchiveIn_00b05380;
  local_b0 = "variables";
  local_a0 = 0;
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&local_78;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->max_speed;
  local_b0 = "max_speed";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->max_wvel;
  local_b0 = "max_wvel";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_time;
  local_b0 = "sleep_time";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_minspeed;
  local_b0 = "sleep_minspeed";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_minwvel;
  local_b0 = "sleep_minwvel";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  local_a8 = (shared_ptr<chrono::collision::ChCollisionModel> *)&this->sleep_starttime;
  local_b0 = "sleep_starttime";
  local_a0 = 0;
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::~vector((vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
             *)local_68);
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  ~vector(&local_48);
  return;
}

Assistant:

void ChBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBody>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);
    // deserialize parent class
    ChBodyFrame::ArchiveIN(marchive);

    // stream in all member data:

    marchive >> CHNVP(bflags);
    bool mflag;  // more readable flag output in case of ASCII in/out
    marchive >> CHNVP(mflag, "is_fixed");
    BFlagSet(BodyFlag::FIXED, mflag);
    marchive >> CHNVP(mflag, "collide");
    BFlagSet(BodyFlag::COLLIDE, mflag);
    marchive >> CHNVP(mflag, "limit_speed");
    BFlagSet(BodyFlag::LIMITSPEED, mflag);
    marchive >> CHNVP(mflag, "no_gyro_torque");
    BFlagSet(BodyFlag::NOGYROTORQUE, mflag);
    marchive >> CHNVP(mflag, "use_sleeping");
    BFlagSet(BodyFlag::USESLEEPING, mflag);
    marchive >> CHNVP(mflag, "is_sleeping");
    BFlagSet(BodyFlag::SLEEPING, mflag);

    std::vector<std::shared_ptr<ChMarker>> tempmarkers;
    std::vector<std::shared_ptr<ChForce>> tempforces;
    marchive >> CHNVP(tempmarkers, "markers");
    marchive >> CHNVP(tempforces, "forces");
    // trick needed because the "Add...() functions are required
    this->RemoveAllMarkers();
    for (auto i : tempmarkers) {
        this->AddMarker(i);
    }
    this->RemoveAllForces();
    for (auto i : tempforces) {
        this->AddForce(i);
    }

    marchive >> CHNVP(body_id);
    marchive >> CHNVP(collision_model);
    collision_model->SetContactable(this);
    marchive >> CHNVP(gyro);
    marchive >> CHNVP(Xforce);
    marchive >> CHNVP(Xtorque);
    // marchive << CHNVP(Force_acc); // not useful in serialization
    // marchive << CHNVP(Torque_acc);// not useful in serialization
    marchive >> CHNVP(density);
    marchive >> CHNVP(variables);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(max_wvel);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleep_starttime);
}